

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleBracketOperator
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *base,TIntermTyped *index)

{
  TSpirvType *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TSampler *this_00;
  reference pvVar5;
  TIntermAggregate *this_01;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar6;
  TIntermTyped *base_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TOperator TVar7;
  TSourceLoc *s;
  undefined1 local_1a8 [8];
  TType derefType;
  TIntermTyped *element;
  TOperator idxOp;
  TIntermTyped *sbArray;
  TIntermTyped *local_f0;
  TIntermTyped *local_e8;
  TIntermTyped *local_e0;
  undefined1 local_d8 [8];
  TType sampReturnType;
  TIntermAggregate *load;
  TSampler *sampler;
  TIntermTyped *index_local;
  TIntermTyped *base_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  s = loc;
  iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))();
  if ((iVar3 == 0xe) &&
     (uVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2a])(), (uVar4 & 1) == 0)) {
    iVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    this_00 = (TSampler *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x40))();
    bVar2 = TSampler::isImage(this_00);
    if ((bVar2) || (bVar2 = TSampler::isTexture(this_00), bVar2)) {
      bVar2 = std::
              vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
              ::empty(&(this->mipsOperatorMipArg).
                       super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                     );
      if ((!bVar2) &&
         (pvVar5 = std::
                   vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                   ::back(&(this->mipsOperatorMipArg).
                           super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                         ), pvVar5->mipLevel == (TIntermTyped *)0x0)) {
        pvVar5 = std::
                 vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                 ::back(&(this->mipsOperatorMipArg).
                         super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                       );
        pvVar5->mipLevel = index;
        return (TIntermTyped *)(HlslParseContext *)base;
      }
      this_01 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)s);
      bVar2 = TSampler::isImage(this_00);
      TVar7 = EOpTextureFetch;
      if (bVar2) {
        TVar7 = EOpImageLoad;
      }
      TIntermAggregate::TIntermAggregate(this_01,TVar7);
      sampReturnType.spirvType = (TSpirvType *)this_01;
      TType::TType((TType *)local_d8,EbtVoid,EvqTemporary,1,0,0,false);
      getTextureReturnType(this,this_00,(TType *)local_d8);
      (*(code *)((sampReturnType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                allocator[2].freeList)(sampReturnType.spirvType,local_d8);
      (*(code *)(((sampReturnType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                allocator)->alignment)(sampReturnType.spirvType,loc);
      pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (*(code *)((sampReturnType.spirvType)->spirvInst).set._M_dataplus.
                         super_allocator_type.allocator[4].alignmentMask)();
      local_e0 = base;
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                (pvVar6,(value_type *)&local_e0);
      pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (*(code *)((sampReturnType.spirvType)->spirvInst).set._M_dataplus.
                         super_allocator_type.allocator[4].alignmentMask)();
      local_e8 = index;
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                (pvVar6,(value_type *)&local_e8);
      bVar2 = TSampler::isTexture(this_00);
      if (bVar2) {
        bVar2 = std::
                vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                ::empty(&(this->mipsOperatorMipArg).
                         super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                       );
        if (bVar2) {
          pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (*(code *)((sampReturnType.spirvType)->spirvInst).set._M_dataplus.
                             super_allocator_type.allocator[4].alignmentMask)();
          sbArray = &TIntermediate::addConstantUnion
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,0,
                                loc,true)->super_TIntermTyped;
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                    (pvVar6,(value_type *)&sbArray);
        }
        else {
          pvVar6 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   (*(code *)((sampReturnType.spirvType)->spirvInst).set._M_dataplus.
                             super_allocator_type.allocator[4].alignmentMask)();
          pvVar5 = std::
                   vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                   ::back(&(this->mipsOperatorMipArg).
                           super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                         );
          local_f0 = pvVar5->mipLevel;
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                    (pvVar6,(value_type *)&local_f0);
          std::
          vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
          ::pop_back(&(this->mipsOperatorMipArg).
                      super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                    );
        }
      }
      pTVar1 = sampReturnType.spirvType;
      TType::~TType((TType *)local_d8);
      return (TIntermTyped *)(HlslParseContext *)pTVar1;
    }
  }
  base_00 = indexStructBufferContent(this,loc,base);
  if (base_00 == (TIntermTyped *)0x0) {
    this_local = (HlslParseContext *)0x0;
  }
  else {
    iVar3 = (*(index->super_TIntermNode)._vptr_TIntermNode[0x21])();
    TVar7 = EOpIndexIndirect;
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8) & 0x7f) == 2) {
      TVar7 = EOpIndexDirect;
    }
    derefType.spirvType =
         (TSpirvType *)
         TIntermediate::addIndex
                   ((this->super_TParseContextBase).super_TParseVersions.intermediate,TVar7,base_00,
                    index,loc);
    iVar3 = (*(base_00->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    TType::TType((TType *)local_1a8,(TType *)CONCAT44(extraout_var_02,iVar3),0,false);
    (*(code *)((derefType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator[2].
              freeList)(derefType.spirvType,local_1a8);
    this_local = (HlslParseContext *)derefType.spirvType;
    TType::~TType((TType *)local_1a8);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::handleBracketOperator(const TSourceLoc& loc, TIntermTyped* base, TIntermTyped* index)
{
    // handle r-value operator[] on textures and images.  l-values will be processed later.
    if (base->getType().getBasicType() == EbtSampler && !base->isArray()) {
        const TSampler& sampler = base->getType().getSampler();
        if (sampler.isImage() || sampler.isTexture()) {
            if (! mipsOperatorMipArg.empty() && mipsOperatorMipArg.back().mipLevel == nullptr) {
                // The first operator[] to a .mips[] sequence is the mip level.  We'll remember it.
                mipsOperatorMipArg.back().mipLevel = index;
                return base;  // next [] index is to the same base.
            } else {
                TIntermAggregate* load = new TIntermAggregate(sampler.isImage() ? EOpImageLoad : EOpTextureFetch);

                TType sampReturnType;
                getTextureReturnType(sampler, sampReturnType);

                load->setType(sampReturnType);
                load->setLoc(loc);
                load->getSequence().push_back(base);
                load->getSequence().push_back(index);

                // Textures need a MIP.  If we saw one go by, use it.  Otherwise, use zero.
                if (sampler.isTexture()) {
                    if (! mipsOperatorMipArg.empty()) {
                        load->getSequence().push_back(mipsOperatorMipArg.back().mipLevel);
                        mipsOperatorMipArg.pop_back();
                    } else {
                        load->getSequence().push_back(intermediate.addConstantUnion(0, loc, true));
                    }
                }

                return load;
            }
        }
    }

    // Handle operator[] on structured buffers: this indexes into the array element of the buffer.
    // indexStructBufferContent returns nullptr if it isn't a structuredbuffer (SSBO).
    TIntermTyped* sbArray = indexStructBufferContent(loc, base);
    if (sbArray != nullptr) {
        // Now we'll apply the [] index to that array
        const TOperator idxOp = (index->getQualifier().storage == EvqConst) ? EOpIndexDirect : EOpIndexIndirect;

        TIntermTyped* element = intermediate.addIndex(idxOp, sbArray, index, loc);
        const TType derefType(sbArray->getType(), 0);
        element->setType(derefType);
        return element;
    }

    return nullptr;
}